

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O2

bool __thiscall
imrt::ApertureILS::isBeamletModifiable
          (ApertureILS *this,int beamlet,Station *station,bool open_flag)

{
  bool bVar1;
  _List_node_base *p_Var2;
  
  p_Var2 = (_List_node_base *)&this->tabu;
  while (p_Var2 = (((_List_base<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
                     *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)&this->tabu) {
    if ((*(int *)((long)p_Var2[1]._M_next + 8) == station->angle) &&
       (*(int *)&p_Var2[1]._M_prev == beamlet)) {
      return false;
    }
  }
  bVar1 = Station::isActiveBeamlet(station,beamlet);
  if (!bVar1) {
    return false;
  }
  if (open_flag) {
    bVar1 = Station::anyClosed(station,beamlet);
    if ((bVar1) && ((this->super_ILS).field_0x25 != '\0')) {
      return true;
    }
    bVar1 = Station::canIncreaseIntensity(station,beamlet);
  }
  else {
    bVar1 = Station::anyOpen(station,beamlet);
    if ((bVar1) && ((this->super_ILS).field_0x25 != '\0')) {
      return true;
    }
    bVar1 = Station::canReduceIntensity(station,beamlet);
  }
  if (bVar1 == false) {
    return false;
  }
  if ((this->super_ILS).field_0x24 == '\0') {
    return false;
  }
  return true;
}

Assistant:

bool ApertureILS::isBeamletModifiable(int beamlet, Station* station, bool open_flag) {
  for (auto it=tabu.begin(); it!=tabu.end();it++){
    if (it->first->getAngle() == station->getAngle() && it->second == beamlet) return(false);
  }
  
  if (!station->isActiveBeamlet(beamlet)) return(false);
  if (!open_flag) {
    if (station->anyOpen(beamlet) && search_aperture)
      return(true);
    if (station->canReduceIntensity(beamlet) && search_intensity)
      return(true);
  } else {
    if (station->anyClosed(beamlet) && search_aperture)
      return(true);
    if (station->canIncreaseIntensity(beamlet) && search_intensity)
      return(true);    
  }
  return(false);
}